

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::buffer_to_packing_standard_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,
          bool support_std430_without_scalar_layout,bool support_enhanced_layouts)

{
  bool bVar1;
  byte bVar2;
  CompilerError *this_00;
  undefined7 in_register_00000009;
  char *pcVar3;
  allocator local_49;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000009,support_std430_without_scalar_layout) != 0) {
    bVar1 = buffer_is_packing_standard(this,type,BufferPackingStd430,(uint32_t *)0x0,0,0xffffffff);
    if (!bVar1) goto LAB_006217c8;
LAB_00621a85:
    pcVar3 = "std430";
LAB_00621a8c:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_48);
    return __return_storage_ptr__;
  }
LAB_006217c8:
  bVar1 = buffer_is_packing_standard(this,type,BufferPackingStd140,(uint32_t *)0x0,0,0xffffffff);
  if (bVar1) {
LAB_006217e2:
    pcVar3 = "std140";
    goto LAB_00621a8c;
  }
  if ((this->options).vulkan_semantics == true) {
    bVar1 = buffer_is_packing_standard(this,type,BufferPackingScalar,(uint32_t *)0x0,0,0xffffffff);
    if (!bVar1) goto LAB_0062184c;
    ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_scalar_block_layout",&local_49);
    require_extension_internal(this,&local_48);
LAB_00621836:
    ::std::__cxx11::string::~string((string *)&local_48);
    pcVar3 = "scalar";
    goto LAB_00621a8c;
  }
LAB_0062184c:
  if (support_std430_without_scalar_layout && support_enhanced_layouts) {
    bVar1 = buffer_is_packing_standard
                      (this,type,BufferPackingStd430EnhancedLayout,(uint32_t *)0x0,0,0xffffffff);
    if (bVar1) {
      bVar1 = (this->options).vulkan_semantics;
      if ((this->options).es == true) {
        if (bVar1 == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Push constant block cannot be expressed as neither std430 nor std140. ES-targets do not support GL_ARB_enhanced_layouts."
                    );
          goto LAB_00621b17;
        }
      }
      else if ((bVar1 == false) && ((this->options).version < 0x1b8)) {
        ::std::__cxx11::string::string((string *)&local_48,"GL_ARB_enhanced_layouts",&local_49);
        require_extension_internal(this,&local_48);
        ::std::__cxx11::string::~string((string *)&local_48);
      }
      Compiler::set_extended_decoration
                (&this->super_Compiler,(type->super_IVariant).self.id,
                 SPIRVCrossDecorationExplicitOffset,0);
      goto LAB_00621a85;
    }
  }
  if (support_enhanced_layouts) {
    bVar1 = buffer_is_packing_standard
                      (this,type,BufferPackingStd140EnhancedLayout,(uint32_t *)0x0,0,0xffffffff);
    if (bVar1) {
      bVar1 = (this->options).vulkan_semantics;
      if ((this->options).es == true) {
        if (bVar1 == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Push constant block cannot be expressed as neither std430 nor std140. ES-targets do not support GL_ARB_enhanced_layouts."
                    );
          goto LAB_00621b17;
        }
      }
      else if ((bVar1 == false) && ((this->options).version < 0x1b8)) {
        ::std::__cxx11::string::string((string *)&local_48,"GL_ARB_enhanced_layouts",&local_49);
        require_extension_internal(this,&local_48);
        ::std::__cxx11::string::~string((string *)&local_48);
      }
      Compiler::set_extended_decoration
                (&this->super_Compiler,(type->super_IVariant).self.id,
                 SPIRVCrossDecorationExplicitOffset,0);
      goto LAB_006217e2;
    }
    if ((this->options).vulkan_semantics == true) {
      bVar1 = buffer_is_packing_standard
                        (this,type,BufferPackingScalarEnhancedLayout,(uint32_t *)0x0,0,0xffffffff);
      if (bVar1) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,(type->super_IVariant).self.id,
                   SPIRVCrossDecorationExplicitOffset,0);
        ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_scalar_block_layout",&local_49);
        require_extension_internal(this,&local_48);
        goto LAB_00621836;
      }
    }
  }
  if (!support_std430_without_scalar_layout) {
    bVar2 = (this->options).vulkan_semantics;
    if ((bool)bVar2 == true) {
      bVar1 = buffer_is_packing_standard(this,type,BufferPackingStd430,(uint32_t *)0x0,0,0xffffffff)
      ;
      if (!bVar1) {
        bVar2 = (this->options).vulkan_semantics;
        goto LAB_006219c6;
      }
      ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_scalar_block_layout",&local_49);
      require_extension_internal(this,&local_48);
LAB_00621a2a:
      ::std::__cxx11::string::~string((string *)&local_48);
      goto LAB_00621a85;
    }
LAB_006219c6:
    if (((bVar2 & 1) != 0) && (support_enhanced_layouts)) {
      bVar1 = buffer_is_packing_standard
                        (this,type,BufferPackingStd430EnhancedLayout,(uint32_t *)0x0,0,0xffffffff);
      if (bVar1) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,(type->super_IVariant).self.id,
                   SPIRVCrossDecorationExplicitOffset,0);
        ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_scalar_block_layout",&local_49);
        require_extension_internal(this,&local_48);
        goto LAB_00621a2a;
      }
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,
             "Buffer block cannot be expressed as any of std430, std140, scalar, even with enhanced layouts. You can try flattening this block to support a more flexible layout."
            );
LAB_00621b17:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::buffer_to_packing_standard(const SPIRType &type,
                                                bool support_std430_without_scalar_layout,
                                                bool support_enhanced_layouts)
{
	if (support_std430_without_scalar_layout && buffer_is_packing_standard(type, BufferPackingStd430))
		return "std430";
	else if (buffer_is_packing_standard(type, BufferPackingStd140))
		return "std140";
	else if (options.vulkan_semantics && buffer_is_packing_standard(type, BufferPackingScalar))
	{
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "scalar";
	}
	else if (support_std430_without_scalar_layout &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd430EnhancedLayout))
	{
		if (options.es && !options.vulkan_semantics)
			SPIRV_CROSS_THROW("Push constant block cannot be expressed as neither std430 nor std140. ES-targets do "
			                  "not support GL_ARB_enhanced_layouts.");
		if (!options.es && !options.vulkan_semantics && options.version < 440)
			require_extension_internal("GL_ARB_enhanced_layouts");

		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		return "std430";
	}
	else if (support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd140EnhancedLayout))
	{
		// Fallback time. We might be able to use the ARB_enhanced_layouts to deal with this difference,
		// however, we can only use layout(offset) on the block itself, not any substructs, so the substructs better be the appropriate layout.
		// Enhanced layouts seem to always work in Vulkan GLSL, so no need for extensions there.
		if (options.es && !options.vulkan_semantics)
			SPIRV_CROSS_THROW("Push constant block cannot be expressed as neither std430 nor std140. ES-targets do "
			                  "not support GL_ARB_enhanced_layouts.");
		if (!options.es && !options.vulkan_semantics && options.version < 440)
			require_extension_internal("GL_ARB_enhanced_layouts");

		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		return "std140";
	}
	else if (options.vulkan_semantics &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingScalarEnhancedLayout))
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "scalar";
	}
	else if (!support_std430_without_scalar_layout && options.vulkan_semantics &&
	         buffer_is_packing_standard(type, BufferPackingStd430))
	{
		// UBOs can support std430 with GL_EXT_scalar_block_layout.
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "std430";
	}
	else if (!support_std430_without_scalar_layout && options.vulkan_semantics &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd430EnhancedLayout))
	{
		// UBOs can support std430 with GL_EXT_scalar_block_layout.
		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "std430";
	}
	else
	{
		SPIRV_CROSS_THROW("Buffer block cannot be expressed as any of std430, std140, scalar, even with enhanced "
		                  "layouts. You can try flattening this block to support a more flexible layout.");
	}
}